

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *ID,UnicodeString *source,
          UnicodeString *target,UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnicodeString *newID;
  TransliteratorEntry *pTStack_38;
  UErrorCode status;
  TransliteratorEntry *adopted_local;
  UnicodeString *variant_local;
  UnicodeString *target_local;
  UnicodeString *source_local;
  UnicodeString *ID_local;
  TransliteratorRegistry *this_local;
  UnicodeString *this_00;
  
  newID._4_4_ = 0;
  pTStack_38 = adopted;
  adopted_local = (TransliteratorEntry *)variant;
  variant_local = target;
  target_local = source;
  source_local = ID;
  ID_local = (UnicodeString *)this;
  Hashtable::put(&this->registry,ID,adopted,(UErrorCode *)((long)&newID + 4));
  if (visible == '\0') {
    removeSTV(this,target_local,variant_local,(UnicodeString *)adopted_local);
    UVector::removeElement(&this->availableIDs,source_local);
  }
  else {
    registerSTV(this,target_local,variant_local,(UnicodeString *)adopted_local);
    UVar1 = UVector::contains(&this->availableIDs,source_local);
    if (UVar1 == '\0') {
      iVar2 = (*(source_local->super_Replaceable).super_UObject._vptr_UObject[7])();
      this_00 = (UnicodeString *)CONCAT44(extraout_var,iVar2);
      if (this_00 != (UnicodeString *)0x0) {
        icu_63::UnicodeString::getTerminatedBuffer(this_00);
        UVector::addElement(&this->availableIDs,this_00,(UErrorCode *)((long)&newID + 4));
      }
    }
  }
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& ID,
                                           const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UErrorCode status = U_ZERO_ERROR;
    registry.put(ID, adopted, status);
    if (visible) {
        registerSTV(source, target, variant);
        if (!availableIDs.contains((void*) &ID)) {
            UnicodeString *newID = (UnicodeString *)ID.clone();
            // Check to make sure newID was created.
            if (newID != NULL) {
                // NUL-terminate the ID string
                newID->getTerminatedBuffer();
                availableIDs.addElement(newID, status);
            }
        }
    } else {
        removeSTV(source, target, variant);
        availableIDs.removeElement((void*) &ID);
    }
}